

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O3

shared_ptr<CellType> __thiscall GameEngine::getCell(GameEngine *this,size_t posX,size_t posY)

{
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  size_t sVar3;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *pvVar4;
  ulong in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  shared_ptr<CellType> sVar6;
  
  sVar3 = Map::getWidth(*(Map **)posX);
  _Var5._M_pi = extraout_RDX;
  if (posY < sVar3) {
    sVar3 = Map::getHeight(*(Map **)posX);
    _Var5._M_pi = extraout_RDX_00;
    if (in_RCX < sVar3) {
      pvVar4 = Map::operator[](*(Map **)posX,in_RCX);
      psVar1 = (pvVar4->
               super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      (this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           psVar1[posY].super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var2 = psVar1[posY].super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
      _Var5._M_pi = extraout_RDX_01;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      goto LAB_00128b7a;
    }
  }
  (this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00128b7a:
  sVar6.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi;
  sVar6.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<CellType>)sVar6.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CellType> GameEngine::getCell(size_t posX, size_t posY) {
  if ((posX >= 0) && (posY >= 0) && (posX < map->getWidth()) && (posY < map->getHeight())) {
    return (*map)[posY][posX];
  } else {
    return nullptr;
  }
}